

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O3

void __thiscall Graph::isAdjoint(Graph *this)

{
  pointer piVar1;
  pointer piVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  int k;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  
  if (this->multigraph_status == true) {
    std::operator<<((ostream *)&std::cerr,"Graph is multigraph! Can\'t be adjoint!");
    exit(1);
  }
  lVar4 = (long)this->num_of_vert;
  if (0 < lVar4) {
    lVar5 = 0;
    uVar3 = 0;
    do {
      piVar1 = this->adj_list[lVar5].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar2 = this->adj_list[lVar5].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (piVar1 != piVar2) {
        uVar7 = (long)piVar2 - (long)piVar1 >> 2;
        lVar8 = 0;
        do {
          if ((lVar5 != lVar8) && (0 < (int)(uint)uVar7)) {
            piVar2 = this->adj_list[lVar8].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar10 = (long)this->adj_list[lVar8].super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_finish - (long)piVar2 >> 2;
            uVar11 = uVar10;
            if (uVar10 < uVar7) {
              uVar11 = uVar7;
            }
            uVar9 = 0;
            iVar6 = 0;
            do {
              if (0 < (int)(uint)uVar10) {
                uVar3 = 0;
                do {
                  iVar6 = iVar6 + (uint)(piVar1[uVar9] == piVar2[uVar3]);
                  uVar3 = uVar3 + 1;
                } while (((uint)uVar10 & 0x7fffffff) != uVar3);
                uVar3 = uVar11 & 0xffffffff;
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != ((uint)uVar7 & 0x7fffffff));
            if (iVar6 != (int)uVar3 && iVar6 != 0) {
              this->adjoint_status = false;
              return;
            }
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 != lVar4);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != lVar4);
  }
  return;
}

Assistant:

void Graph::isAdjoint(){
   if(this->multigraph_status){
      cerr << "Graph is multigraph! Can't be adjoint!";
      exit(EXIT_FAILURE);
   }
   int nv = this->num_of_vert, size = 0, common_els = 0;
   for(int i = 0; i < nv; i++){
      // checks if there is any vertex that has any successors
      if(not(this->adj_list[i].empty()))
         for(int j = 0; j < nv; j++){
            if (i == j)
               continue;
            common_els = 0;
            if(this->adj_list[i].empty() and this->adj_list[j].empty())
               continue;
            for(int k = 0; k < (int)this->adj_list[i].size(); k++){
               for(int l = 0; l < (int)this->adj_list[j].size(); l++){
                  // sets the number of our common elements
                  if(this->adj_list[i].size() >= this->adj_list[j].size())
                     size = (int)this->adj_list[i].size();
                  else
                     size = (int)this->adj_list[j].size();
                  // if we found common element, then we increment
                  if(this->adj_list[i][k] == this->adj_list[j][l])
                     common_els++;
               }
            }
            // graph not adjoint; common elements for two vertices are not equal and this is not empty set
            if((common_els not_eq size) and
               (common_els not_eq 0)){
               this->adjoint_status = false;
               return void();
            }
         }
   }
   return void();
}